

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderImageSizeTests.cpp
# Opt level: O2

bool __thiscall
glcts::anon_unknown_0::ImageSizeMachine::Equal(ImageSizeMachine *this,ivec4 *result,ivec4 *expected)

{
  undefined1 auVar1 [16];
  
  auVar1[0] = -((char)result->m_data[0] == *(char *)&(this->super_GLWrapper)._vptr_GLWrapper);
  auVar1[1] = -(*(char *)((long)result->m_data + 1) ==
               *(char *)((long)&(this->super_GLWrapper)._vptr_GLWrapper + 1));
  auVar1[2] = -(*(char *)((long)result->m_data + 2) ==
               *(char *)((long)&(this->super_GLWrapper)._vptr_GLWrapper + 2));
  auVar1[3] = -(*(char *)((long)result->m_data + 3) ==
               *(char *)((long)&(this->super_GLWrapper)._vptr_GLWrapper + 3));
  auVar1[4] = -((char)result->m_data[1] ==
               *(char *)((long)&(this->super_GLWrapper)._vptr_GLWrapper + 4));
  auVar1[5] = -(*(char *)((long)result->m_data + 5) ==
               *(char *)((long)&(this->super_GLWrapper)._vptr_GLWrapper + 5));
  auVar1[6] = -(*(char *)((long)result->m_data + 6) ==
               *(char *)((long)&(this->super_GLWrapper)._vptr_GLWrapper + 6));
  auVar1[7] = -(*(char *)((long)result->m_data + 7) ==
               *(char *)((long)&(this->super_GLWrapper)._vptr_GLWrapper + 7));
  auVar1[8] = -((char)result->m_data[2] ==
               *(char *)&(this->super_GLWrapper).super_CallLogWrapper.m_gl);
  auVar1[9] = -(*(char *)((long)result->m_data + 9) ==
               *(char *)((long)&(this->super_GLWrapper).super_CallLogWrapper.m_gl + 1));
  auVar1[10] = -(*(char *)((long)result->m_data + 10) ==
                *(char *)((long)&(this->super_GLWrapper).super_CallLogWrapper.m_gl + 2));
  auVar1[0xb] = -(*(char *)((long)result->m_data + 0xb) ==
                 *(char *)((long)&(this->super_GLWrapper).super_CallLogWrapper.m_gl + 3));
  auVar1[0xc] = -((char)result->m_data[3] ==
                 *(char *)((long)&(this->super_GLWrapper).super_CallLogWrapper.m_gl + 4));
  auVar1[0xd] = -(*(char *)((long)result->m_data + 0xd) ==
                 *(char *)((long)&(this->super_GLWrapper).super_CallLogWrapper.m_gl + 5));
  auVar1[0xe] = -(*(char *)((long)result->m_data + 0xe) ==
                 *(char *)((long)&(this->super_GLWrapper).super_CallLogWrapper.m_gl + 6));
  auVar1[0xf] = -(*(char *)((long)result->m_data + 0xf) ==
                 *(char *)((long)&(this->super_GLWrapper).super_CallLogWrapper.m_gl + 7));
  return (ushort)((ushort)(SUB161(auVar1 >> 7,0) & 1) | (ushort)(SUB161(auVar1 >> 0xf,0) & 1) << 1 |
                  (ushort)(SUB161(auVar1 >> 0x17,0) & 1) << 2 |
                  (ushort)(SUB161(auVar1 >> 0x1f,0) & 1) << 3 |
                  (ushort)(SUB161(auVar1 >> 0x27,0) & 1) << 4 |
                  (ushort)(SUB161(auVar1 >> 0x2f,0) & 1) << 5 |
                  (ushort)(SUB161(auVar1 >> 0x37,0) & 1) << 6 |
                  (ushort)(SUB161(auVar1 >> 0x3f,0) & 1) << 7 |
                  (ushort)(SUB161(auVar1 >> 0x47,0) & 1) << 8 |
                  (ushort)(SUB161(auVar1 >> 0x4f,0) & 1) << 9 |
                  (ushort)(SUB161(auVar1 >> 0x57,0) & 1) << 10 |
                  (ushort)(SUB161(auVar1 >> 0x5f,0) & 1) << 0xb |
                  (ushort)(SUB161(auVar1 >> 0x67,0) & 1) << 0xc |
                  (ushort)(SUB161(auVar1 >> 0x6f,0) & 1) << 0xd |
                  (ushort)(SUB161(auVar1 >> 0x77,0) & 1) << 0xe | (ushort)(auVar1[0xf] >> 7) << 0xf)
         == 0xffff;
}

Assistant:

inline bool Equal(const ivec4& result, const ivec4& expected)
	{
		if (expected[0] != result[0])
			return false;
		if (expected[1] != result[1])
			return false;
		if (expected[2] != result[2])
			return false;
		if (expected[3] != result[3])
			return false;
		return true;
	}